

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFMT.cpp
# Opt level: O1

void __thiscall FRandom::GenRandArray(FRandom *this,w128_t *array,int size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  QWORD QVar8;
  QWORD QVar9;
  undefined8 uVar10;
  long lVar11;
  QWORD QVar12;
  w128_t *pwVar13;
  w128_t *pwVar14;
  w128_t *pwVar15;
  long lVar16;
  w128_t *pwVar17;
  QWORD *pQVar18;
  ulong uVar19;
  w128_t *pwVar20;
  ulong uVar21;
  ulong uVar22;
  
  lVar16 = 0xc;
  pwVar15 = (w128_t *)((this->sfmt).u64 + 6);
  pwVar17 = (w128_t *)((this->sfmt).u + 0x10);
  pwVar14 = array;
  do {
    pwVar20 = pwVar14;
    pwVar13 = pwVar17;
    uVar3 = pwVar15->u[3];
    QVar12 = pwVar15->u64[1];
    QVar9 = pwVar15->u64[1];
    QVar8 = pwVar15->u64[0];
    uVar4 = *(uint *)((long)&this->sfmt + lVar16);
    uVar5 = *(uint *)(&this->field_0x14 + lVar16);
    uVar6 = *(uint *)((long)&this->Next + lVar16 + 4);
    uVar7 = *(uint *)((long)&this->NameCRC + lVar16);
    pwVar20->u[0] =
         pwVar13->u[0] << 0xf ^ (uint)(QVar8 >> 0x18) ^
         (*(uint *)((long)&this->sfmt + lVar16 + 0x14) >> 0xd & 0x737ff | uVar6 << 0x18) ^ uVar6;
    pwVar20->u[1] =
         *(uint *)((long)&this->sfmt + lVar16 + 0x18) >> 0xd & 0x73f7d ^
         ((uint)(byte)(QVar8 >> 0x38) | (uint)(((ulong)(uint)QVar12 << 0x28) >> 0x20)) ^
         pwVar13->u[1] << 0xf ^
         ((uint)(((ulong)uVar7 << 0x38) >> 0x20) | uVar6 >> 8) ^
         *(uint *)((long)&this->NameCRC + lVar16);
    pwVar20->u[2] =
         (uint)(QVar9 >> 0x18) ^ (uVar5 << 0x18 | uVar7 >> 8) ^
         *(uint *)(&this->field_0x14 + lVar16) ^
         pwVar13->u[2] << 0xf ^ *(uint *)((long)&this->sfmt + lVar16 + 0x1c) >> 0xd & 0x77b7d;
    pwVar20->u[3] =
         uVar3 >> 0x18 ^ ((uint)(((ulong)uVar4 << 0x38) >> 0x20) | uVar5 >> 8) ^
         *(uint *)((long)&this->sfmt + lVar16) ^
         pwVar13->u[3] << 0xf ^ *(uint *)((long)&this->sfmt + lVar16 + 0x20) >> 0xd & 0x7fb2f;
    lVar16 = lVar16 + 0x10;
    pwVar15 = pwVar13;
    pwVar17 = pwVar20;
    pwVar14 = pwVar20 + 1;
  } while (lVar16 != 0x3c);
  lVar16 = 0;
  do {
    pwVar15 = pwVar20;
    uVar3 = pwVar13->u[3];
    QVar12 = pwVar13->u64[1];
    QVar9 = pwVar13->u64[1];
    QVar8 = pwVar13->u64[0];
    uVar4 = *(uint *)((long)&this->sfmt + lVar16 + 0x3c);
    uVar5 = *(uint *)((long)&this->sfmt + lVar16 + 0x38);
    uVar6 = *(uint *)((long)&this->sfmt + lVar16 + 0x30);
    uVar7 = *(uint *)((long)&this->sfmt + lVar16 + 0x34);
    *(DWORD *)((long)array + lVar16 + 0x30) =
         pwVar15->u[0] << 0xf ^ (uint)(QVar8 >> 0x18) ^
         (*(uint *)((long)array + lVar16) >> 0xd & 0x737ff | uVar6 << 0x18) ^ uVar6;
    *(uint *)((long)array + lVar16 + 0x34) =
         *(uint *)((long)array + lVar16 + 4) >> 0xd & 0x73f7d ^
         ((uint)(byte)(QVar8 >> 0x38) | (uint)(((ulong)(uint)QVar12 << 0x28) >> 0x20)) ^
         pwVar15->u[1] << 0xf ^
         ((uint)(((ulong)uVar7 << 0x38) >> 0x20) | uVar6 >> 8) ^
         *(uint *)((long)&this->sfmt + lVar16 + 0x34);
    *(uint *)((long)array + lVar16 + 0x38) =
         (uint)(QVar9 >> 0x18) ^ (uVar5 << 0x18 | uVar7 >> 8) ^
         *(uint *)((long)&this->sfmt + lVar16 + 0x38) ^
         pwVar15->u[2] << 0xf ^ *(uint *)((long)array + lVar16 + 8) >> 0xd & 0x77b7d;
    *(uint *)((long)array + lVar16 + 0x3c) =
         uVar3 >> 0x18 ^ ((uint)(((ulong)uVar4 << 0x38) >> 0x20) | uVar5 >> 8) ^
         *(uint *)((long)&this->sfmt + lVar16 + 0x3c) ^
         pwVar15->u[3] << 0xf ^ *(uint *)((long)array + lVar16 + 0xc) >> 0xd & 0x7fb2f;
    lVar11 = lVar16 + 0x30;
    lVar16 = lVar16 + 0x10;
    pwVar13 = pwVar15;
    pwVar20 = (w128_t *)((long)array + lVar11);
  } while (lVar16 != 0x20);
  pwVar17 = array + 4;
  uVar19 = 5;
  if (10 < size) {
    uVar19 = 5;
    pwVar14 = pwVar15;
    do {
      pwVar15 = pwVar17;
      uVar3 = pwVar14->u[3];
      QVar12 = pwVar14->u64[1];
      QVar9 = pwVar14->u64[1];
      QVar8 = pwVar14->u64[0];
      uVar4 = pwVar15[-4].u[0];
      uVar5 = *(uint *)((long)pwVar15 + -0x3c);
      uVar6 = *(uint *)((long)pwVar15 + -0x38);
      pwVar15[1].u[0] =
           pwVar15->u[0] << 0xf ^ (uint)(QVar8 >> 0x18) ^
           (pwVar15[-2].u[0] >> 0xd & 0x737ff | uVar4 << 0x18) ^ uVar4;
      *(DWORD *)((long)pwVar15 + 0x14) =
           pwVar15->u[1] << 0xf ^ *(uint *)((long)pwVar15 + -0x1c) >> 0xd & 0x73f7d ^ uVar5 ^
           ((uint)(byte)(QVar8 >> 0x38) | (uint)(((ulong)(uint)QVar12 << 0x28) >> 0x20)) ^
           ((uint)(((ulong)uVar5 << 0x38) >> 0x20) | uVar4 >> 8);
      *(DWORD *)((long)pwVar15 + 0x18) =
           pwVar15->u[2] << 0xf ^ uVar6 ^
           (uint)(QVar9 >> 0x18) ^
           *(uint *)((long)pwVar15 + -0x18) >> 0xd & 0x77b7d ^ (uVar6 << 0x18 | uVar5 >> 8);
      *(DWORD *)((long)pwVar15 + 0x1c) =
           pwVar15->u[3] << 0xf ^ *(uint *)((long)pwVar15 + -0x34) ^
           *(uint *)((long)pwVar15 + -0x14) >> 0xd & 0x7fb2f ^ uVar3 >> 0x18 ^
           ((uint)(((ulong)*(uint *)((long)pwVar15 + -0x34) << 0x38) >> 0x20) | uVar6 >> 8);
      pwVar17 = pwVar15 + 1;
      uVar19 = uVar19 + 1;
      pwVar14 = pwVar15;
    } while (size - 5 != uVar19);
  }
  if (size < 10) {
    uVar22 = 1;
    if (1 < (int)(10U - size)) {
      uVar22 = (ulong)(10U - size);
    }
    lVar16 = 0x18;
    uVar21 = 0;
    do {
      puVar2 = (undefined8 *)((long)array + lVar16 + (long)size * 0x10 + -0x68);
      uVar10 = puVar2[1];
      puVar1 = (undefined8 *)((long)&this->Name + lVar16);
      *puVar1 = *puVar2;
      puVar1[1] = uVar10;
      uVar21 = uVar21 + 1;
      lVar16 = lVar16 + 0x10;
    } while (uVar22 != uVar21);
  }
  else {
    uVar21 = 0;
  }
  if ((int)uVar19 < size) {
    lVar16 = (ulong)(uint)size - (uVar19 & 0xffffffff);
    pQVar18 = (QWORD *)((long)&this->sfmt + uVar21 * 0x10);
    pwVar14 = array + (uVar19 & 0xffffffff);
    do {
      uVar3 = pwVar15->u[3];
      QVar12 = pwVar15->u64[1];
      QVar9 = pwVar15->u64[1];
      QVar8 = pwVar15->u64[0];
      uVar4 = pwVar14[-5].u[0];
      uVar5 = *(uint *)((long)pwVar14 + -0x4c);
      uVar6 = *(uint *)((long)pwVar14 + -0x48);
      pwVar14->u[0] =
           pwVar17->u[0] << 0xf ^ (uint)(QVar8 >> 0x18) ^
           (pwVar14[-3].u[0] >> 0xd & 0x737ff | uVar4 << 0x18) ^ uVar4;
      pwVar14->u[1] =
           pwVar17->u[1] << 0xf ^ *(uint *)((long)pwVar14 + -0x2c) >> 0xd & 0x73f7d ^ uVar5 ^
           ((uint)(byte)(QVar8 >> 0x38) | (uint)(((ulong)(uint)QVar12 << 0x28) >> 0x20)) ^
           ((uint)(((ulong)uVar5 << 0x38) >> 0x20) | uVar4 >> 8);
      pwVar14->u[2] =
           pwVar17->u[2] << 0xf ^ uVar6 ^
           (uint)(QVar9 >> 0x18) ^
           *(uint *)((long)pwVar14 + -0x28) >> 0xd & 0x77b7d ^ (uVar6 << 0x18 | uVar5 >> 8);
      pwVar14->u[3] =
           pwVar17->u[3] << 0xf ^ *(uint *)((long)pwVar14 + -0x44) ^
           *(uint *)((long)pwVar14 + -0x24) >> 0xd & 0x7fb2f ^ uVar3 >> 0x18 ^
           ((uint)(((ulong)*(uint *)((long)pwVar14 + -0x44) << 0x38) >> 0x20) | uVar6 >> 8);
      QVar8 = pwVar14->u64[1];
      *pQVar18 = pwVar14->u64[0];
      pQVar18[1] = QVar8;
      pQVar18 = pQVar18 + 2;
      lVar16 = lVar16 + -1;
      pwVar15 = pwVar17;
      pwVar17 = pwVar14;
      pwVar14 = pwVar14 + 1;
    } while (lVar16 != 0);
  }
  return;
}

Assistant:

void FRandom::GenRandArray(w128_t *array, int size)
{
	int i, j;
	w128_t *r1, *r2;

	r1 = &sfmt.w128[SFMT::N - 2];
	r2 = &sfmt.w128[SFMT::N - 1];
	for (i = 0; i < SFMT::N - POS1; i++) {
		do_recursion(&array[i], &sfmt.w128[i], &sfmt.w128[i + POS1], r1, r2);
		r1 = r2;
		r2 = &array[i];
	}
	for (; i < SFMT::N; i++) {
		do_recursion(&array[i], &sfmt.w128[i], &array[i + POS1 - SFMT::N], r1, r2);
		r1 = r2;
		r2 = &array[i];
	}
	for (; i < size - SFMT::N; i++) {
		do_recursion(&array[i], &array[i - SFMT::N], &array[i + POS1 - SFMT::N], r1, r2);
		r1 = r2;
		r2 = &array[i];
	}
	for (j = 0; j < 2 * SFMT::N - size; j++) {
		sfmt.w128[j] = array[j + size - SFMT::N];
	}
	for (; i < size; i++, j++) {
		do_recursion(&array[i], &array[i - SFMT::N], &array[i + POS1 - SFMT::N], r1, r2);
		r1 = r2;
		r2 = &array[i];
		sfmt.w128[j] = array[i];
	}
}